

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.cpp
# Opt level: O0

ExprPtr __thiscall mathiu::impl::solve(impl *this,ExprPtr *ex,ExprPtr *var,ExprPtr *domain)

{
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  pat;
  ostream *poVar1;
  element_type *__v;
  Symbol *pSVar2;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *in_R8;
  ExprPtr EVar3;
  PatternHelper<matchit::impl::Wildcard> local_a19;
  anon_class_24_3_072191a5 local_a18;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:93:27)>
  local_a00;
  Id<mathiu::impl::PieceWise> local_9e0;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_9b0;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  local_960;
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>_>
  local_8f8;
  anon_class_24_3_a3f336bb local_890;
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:89:57)>
  local_878;
  Id<mathiu::impl::Product> local_7f8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
  local_7b0;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  local_748;
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>_>
  local_6c8;
  anon_class_24_3_0722ccf9 local_648;
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:80:47)>
  local_630;
  Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:70:37)>
  local_598;
  shared_ptr<const_mathiu::impl::Expr> local_590;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>
  local_580;
  PatternPair<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:70:37)>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
  local_578;
  undefined1 local_568 [40];
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>_>
  local_540;
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>_>_>
  local_500;
  shared_ptr<const_mathiu::impl::Expr> local_4c0;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>
  local_4b0;
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
  local_4a8;
  undefined4 local_45c;
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_458;
  App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  local_400;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  local_388;
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>_>
  local_2f8;
  anon_class_32_4_8b53a5bf local_268;
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:76:84)>
  local_248;
  undefined1 local_198 [16];
  Id<mathiu::impl::PieceWise> iPieceWise;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE1;
  Id<mathiu::impl::Product> iP;
  Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:70:37)>
  local_c0;
  Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:70:37)>
  freeOfVar;
  Symbol var_;
  string local_78;
  string local_48;
  impl *local_28;
  ExprPtr *domain_local;
  ExprPtr *var_local;
  ExprPtr *ex_local;
  
  local_28 = (impl *)domain;
  domain_local = var;
  var_local = ex;
  ex_local = (ExprPtr *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"solve: ");
  toString_abi_cxx11_(&local_48,(impl *)var_local,ex_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,",\t");
  toString_abi_cxx11_(&local_78,(impl *)domain_local,ex_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  poVar1 = std::operator<<(poVar1,",\t");
  toString_abi_cxx11_((string *)
                      ((long)&var_.
                              super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                              ._M_elems[0].field_2 + 8),local_28,ex_02);
  poVar1 = std::operator<<(poVar1,(string *)
                                  (var_.
                                   super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                                   ._M_elems[0].field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             (var_.
              super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
              ._M_elems[0].field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  __v = std::__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)domain_local);
  pSVar2 = std::
           get<mathiu::impl::Symbol,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                     (&__v->super_ExprVariant);
  Symbol::Symbol((Symbol *)&freeOfVar,pSVar2);
  iP.mBlock.
  super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ._64_8_ = domain_local;
  local_c0 = matchit::impl::
             meet<mathiu::impl::solve(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::__0>
                       ((anon_class_8_1_ba1d8287 *)
                        ((long)&iP.mBlock.
                                super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                                .
                                super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                                .
                                super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                                .
                                super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                                .
                                super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                        + 0x40));
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)
             ((long)&iE1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&iE2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&iPieceWise.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
             + 0x28));
  matchit::impl::Id<mathiu::impl::PieceWise>::Id((Id<mathiu::impl::PieceWise> *)(local_198 + 8));
  local_198._0_8_ = matchit::impl::match<std::shared_ptr<mathiu::impl::Expr_const>const&>(var_local)
  ;
  local_268.iE1 =
       (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
       ((long)&iE2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       + 0x20);
  local_268.iE2 =
       (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
       ((long)&iPieceWise.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
       + 0x28);
  local_268.var = domain_local;
  local_268.domain = (ExprPtr *)local_28;
  local_45c = 0;
  matchit::impl::
  ds<mathiu::impl::RelationalKind,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>
            (&local_458,(impl *)&local_45c,(RelationalKind *)local_268.iE1,local_268.iE2,in_R8);
  matchit::impl::
  as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_400,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
             ,&local_458);
  matchit::impl::$_2::operator()(&local_388,(__2 *)&matchit::impl::some,&local_400);
  matchit::impl::PatternPipable::operator|
            (&local_2f8,(PatternPipable *)&matchit::impl::pattern,&local_388);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Ds<mathiu::impl::RelationalKind,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>>>>>
  ::operator=(&local_248,
              (PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<mathiu::impl::RelationalKind,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>>>>>
               *)&local_2f8,&local_268);
  set<std::shared_ptr<mathiu::impl::Expr_const>const&>((impl *)&local_4c0,domain_local);
  local_4b0 = matchit::impl::expr<std::shared_ptr<mathiu::impl::Expr_const>>(&local_4c0);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
              *)local_568,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,0);
  pat.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)local_568._8_8_;
  pat.mUnary = (AsPointer<int> *)local_568._0_8_;
  pat.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl._8_8_ = local_568._16_8_;
  pat.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)local_568._24_8_;
  pat.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl._8_8_ = local_568._32_8_;
  matchit::impl::$_2::operator()(&local_540,(__2 *)&matchit::impl::some,pat);
  matchit::impl::PatternPipable::operator|
            (&local_500,(PatternPipable *)&matchit::impl::pattern,&local_540);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,int>>>>>>
  ::operator=(&local_4a8,
              (PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>>>>
               *)&local_500,&local_4b0);
  set<>();
  local_580 = matchit::impl::expr<std::shared_ptr<mathiu::impl::Expr_const>>(&local_590);
  local_598.super_anon_class_8_1_ba1d8287.var =
       (anon_class_8_1_ba1d8287)
       matchit::impl::PatternPipable::operator|((PatternPipable *)&matchit::impl::pattern,&local_c0)
  ;
  local_578 = matchit::impl::
              PatternHelper<matchit::impl::Meet<mathiu::impl::solve(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::$_0>>
              ::operator=((PatternHelper<matchit::impl::Meet<mathiu::impl::solve(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::__0>>
                           *)&local_598,&local_580);
  local_648.iP = (Id<mathiu::impl::Product> *)
                 ((long)&iE1.mBlock.
                         super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                         .
                         super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                         .
                         super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                         .
                         super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                         .
                         super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                 + 0x20);
  local_648.var = domain_local;
  local_648.domain = (ExprPtr *)local_28;
  matchit::impl::Id<mathiu::impl::Product>::Id(&local_7f8,local_648.iP);
  matchit::impl::as<mathiu::impl::Product>::{lambda(auto:1)#1}::operator()
            (&local_7b0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Product>,&local_7f8);
  matchit::impl::$_2::operator()(&local_748,(__2 *)&matchit::impl::some,&local_7b0);
  matchit::impl::PatternPipable::operator|
            (&local_6c8,(PatternPipable *)&matchit::impl::pattern,&local_748);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Product>>>>>>>
  ::operator=(&local_630,
              (PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Product>>>>>>>
               *)&local_6c8,&local_648);
  local_890.iPieceWise = (Id<mathiu::impl::PieceWise> *)(local_198 + 8);
  local_890.var = domain_local;
  local_890.domain = (ExprPtr *)local_28;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id(&local_9e0,local_890.iPieceWise);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_9b0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,&local_9e0
            );
  matchit::impl::$_2::operator()(&local_960,(__2 *)&matchit::impl::some,&local_9b0);
  matchit::impl::PatternPipable::operator|
            (&local_8f8,(PatternPipable *)&matchit::impl::pattern,&local_960);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>>>>
  ::operator=(&local_878,
              (PatternHelper<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>>>>
               *)&local_8f8,&local_890);
  local_a18.ex = var_local;
  local_a18.var = domain_local;
  local_a18.domain = (ExprPtr *)local_28;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator=(&local_a00,&local_a19,&local_a18)
  ;
  matchit::impl::MatchHelper<std::shared_ptr<mathiu::impl::Expr_const>const&,true>::operator()
            ((MatchHelper<std::shared_ptr<mathiu::impl::Expr_const>const&,true> *)this,
             (PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:76:84)>
              *)local_198,
             (PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
              *)&local_248,
             (PatternPair<matchit::impl::Meet<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:70:37)>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
              *)&local_4a8,
             (PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:80:47)>
              *)&local_578,
             (PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:89:57)>
              *)&local_630,
             (PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_solve_cpp:93:27)>
              *)&local_878);
  matchit::impl::
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/solve.cpp:89:57)>
  ::~PatternPair(&local_878);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>_>
  ::~PatternHelper(&local_8f8);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  ::~And(&local_960);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::~App(&local_9b0);
  matchit::impl::Id<mathiu::impl::PieceWise>::~Id(&local_9e0);
  matchit::impl::
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/solve.cpp:80:47)>
  ::~PatternPair(&local_630);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>_>
  ::~PatternHelper(&local_6c8);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>_>_>
  ::~And(&local_748);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
  ::~App(&local_7b0);
  matchit::impl::Id<mathiu::impl::Product>::~Id(&local_7f8);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_590);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_4c0);
  matchit::impl::
  PatternPair<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/solve.cpp:76:84)>
  ::~PatternPair(&local_248);
  matchit::impl::
  PatternHelper<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>_>
  ::~PatternHelper(&local_2f8);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>_>_>
  ::~And(&local_388);
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  ::~App(&local_400);
  matchit::impl::
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~Ds(&local_458);
  matchit::impl::Id<mathiu::impl::PieceWise>::~Id((Id<mathiu::impl::PieceWise> *)(local_198 + 8));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::~Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&iPieceWise.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
             + 0x28));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::~Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&iE2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<mathiu::impl::Product>::~Id
            ((Id<mathiu::impl::Product> *)
             ((long)&iE1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  Symbol::~Symbol((Symbol *)&freeOfVar);
  EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr solve(ExprPtr const &ex, ExprPtr const &var, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "solve: " << toString(ex) << ",\t" << toString(var) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        auto const var_ = std::get<Symbol>(*var);
        using namespace matchit;
        const auto freeOfVar = meet([&](auto &&e)
                                    { return freeOf(e, var); });
        Id<Product> iP;
        Id<ExprPtr> iE1, iE2;
        Id<PieceWise> iPieceWise;
        return match(ex)(
            pattern | some(as<Relational>(ds(RelationalKind::kEQUAL, iE1, iE2))) = [&]
            { return solve(expand(*iE1 - *iE2), var, domain); },
            pattern | some(as<Integer>(0)) = expr(set(var)),
            pattern | freeOfVar = expr(set()),
            pattern | some(as<Product>(iP)) = [&]
            {
                auto solutionSet = std::accumulate((*iP).begin(), (*iP).end(), Set{}, [&](Set solutions, auto &&e)
                                                   {
                                                       solutions.merge(const_cast<Set &>(std::get<Set>(*solve(e.second, var, domain)))); // it is safe to const_cast a temp.
                                                       return solutions;
                                                   });
                return makeSharedExprPtr(std::move(solutionSet));
            },
            pattern | some(as<PieceWise>(iPieceWise)) = [&]
            { return std::accumulate((*iPieceWise).begin(), (*iPieceWise).end(), false_, [&](auto &&result, auto &&e)
                                     { return union_(result, solve(e.first, var, solveInequation(e.second, var, domain))); }); },
            // assume is poly
            pattern | _ = [&]
            {
                auto const sol = solvePoly(ex, var);
                return intersect(sol, domain);
            });
    }